

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::DrawColumnRt4CopyPalCommand,int,int&,int&,int&>
               (int *args,int *args_1,int *args_2,int *args_3)

{
  DrawColumnRt4CopyPalCommand *pDVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  value_type local_b8;
  DrawColumnRt4CopyPalCommand *local_b0;
  DrawColumnRt4CopyPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_8a;
  _lambda_void___1_ local_89;
  undefined1 local_88 [8];
  DrawColumnRt4CopyPalCommand command;
  DrawerCommandQueue *queue;
  int *args_local_3;
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  
  command.super_PalRtCommand._80_8_ = Instance();
  if ((((DrawerCommandQueue *)command.super_PalRtCommand._80_8_)->threaded_render == 0) ||
     (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::DrawColumnRt4CopyPalCommand::PalRtCommand
              ((DrawColumnRt4CopyPalCommand *)local_88,*args,*args_1,*args_2,*args_3);
    tryBlock = QueueCommand(int&&,int&,int&,int&)::{lambda(void*)#1}::
               operator_cast_to_function_pointer(&local_89);
    catchBlock = QueueCommand(int&&,int&,int&,int&)::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_8a);
    VectoredTryCatch((DrawColumnRt4CopyPalCommand *)local_88,tryBlock,catchBlock);
    swrenderer::DrawColumnRt4CopyPalCommand::~DrawColumnRt4CopyPalCommand
              ((DrawColumnRt4CopyPalCommand *)local_88);
  }
  else {
    command_1 = (DrawColumnRt4CopyPalCommand *)AllocMemory(0x58);
    if (command_1 == (DrawColumnRt4CopyPalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command.super_PalRtCommand._80_8_);
      command_1 = (DrawColumnRt4CopyPalCommand *)AllocMemory(0x58);
      if (command_1 == (DrawColumnRt4CopyPalCommand *)0x0) {
        return;
      }
    }
    pDVar1 = command_1;
    swrenderer::DrawColumnRt4CopyPalCommand::PalRtCommand(command_1,*args,*args_1,*args_2,*args_3);
    local_b0 = pDVar1;
    local_b8 = (value_type)pDVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + command.super_PalRtCommand._80_8_ + 0x599518),&local_b8
              );
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}